

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::
optimize_functor<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>,_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>
::operator()(optimize_functor<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>,_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>
             *this,atomic_bool *stop_task,
            best_solution_recorder<baryonyx::itm::default_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
            *best_recorder,
            vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
            *constraints,int variables,default_cost_type<double> *original_costs,
            double cost_constant)

{
  ulong uVar1;
  double dVar2;
  double __y;
  double theta_00;
  double kappa_00;
  double objective_amplifier;
  double dVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int *piVar7;
  double dVar8;
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double local_1d0;
  uint local_1b8;
  int iter;
  int remaining_1;
  int push;
  int remaining;
  long i;
  double dStack_198;
  int best_remaining;
  double kappa;
  double kappa_start;
  undefined1 local_180 [7];
  bool is_a_solution;
  compute_order compute;
  solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
  slv;
  long w_limit;
  double pushing_objective_amplifier;
  double pushing_k_factor;
  double delta;
  double theta;
  double alpha;
  double kappa_max;
  double kappa_step;
  undefined1 local_68 [8];
  default_cost_type<double> norm_costs;
  solver_parameters *p;
  bit_array x;
  double cost_constant_local;
  default_cost_type<double> *original_costs_local;
  int variables_local;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  *constraints_local;
  best_solution_recorder<baryonyx::itm::default_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
  *best_recorder_local;
  atomic_bool *stop_task_local;
  optimize_functor<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>,_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>_>
  *this_local;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  x.super_bit_array_impl.m_data._M_t.
  super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true>)
       (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true>)
       cost_constant;
  bit_array::bit_array((bit_array *)&p,variables);
  norm_costs.linear_elements._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
  .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)this->m_ctx;
  normalize_costs<double,baryonyx::itm::default_cost_type<double>>
            ((itm *)local_68,this->m_ctx,original_costs,&(this->m_local_ctx).rng,variables);
  uVar1 = *(ulong *)((long)norm_costs.linear_elements._M_t.
                           super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                           super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x20);
  dVar2 = *(double *)
           ((long)norm_costs.linear_elements._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x28);
  __y = *(double *)
         ((long)norm_costs.linear_elements._M_t.
                super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x30);
  theta_00 = *(double *)
              ((long)norm_costs.linear_elements._M_t.
                     super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                     super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                     super__Head_base<0UL,_double_*,_false>._M_head_impl + 8);
  if (0.0 <= *(double *)
              ((long)norm_costs.linear_elements._M_t.
                     super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                     super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                     super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10)) {
    local_1d0 = *(double *)
                 ((long)norm_costs.linear_elements._M_t.
                        super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                        super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                        super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x10);
  }
  else {
    local_1d0 = compute_delta<double,baryonyx::itm::default_cost_type<double>>
                          (this->m_ctx,(default_cost_type<double> *)local_68,theta_00,variables);
  }
  kappa_00 = *(double *)
              ((long)norm_costs.linear_elements._M_t.
                     super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                     super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                     super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x38);
  objective_amplifier =
       *(double *)
        ((long)norm_costs.linear_elements._M_t.
               super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
               super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
               super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x40);
  dVar3 = *(double *)
           ((long)norm_costs.linear_elements._M_t.
                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0xa0);
  iVar6 = length<std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
                    (constraints);
  solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
  ::solver_inequalities_101coeff
            ((solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
              *)&compute.order,&(this->m_local_ctx).rng,iVar6,variables,(cost_type *)local_68,
             constraints);
  compute_order::compute_order
            ((compute_order *)local_180,
             *(constraint_order *)
              ((long)norm_costs.linear_elements._M_t.
                     super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                     super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                     super__Head_base<0UL,_double_*,_false>._M_head_impl + 0xcc),variables);
  kappa_start._7_1_ = 0;
  do {
    bVar4 = std::atomic<bool>::load(stop_task,seq_cst);
    if (((bVar4 ^ 0xffU) & 1) == 0) {
      compute_order::~compute_order((compute_order *)local_180);
      solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
      ::~solver_inequalities_101coeff
                ((solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                  *)&compute.order);
      default_cost_type<double>::~default_cost_type((default_cost_type<double> *)local_68);
      bit_array::~bit_array((bit_array *)&p);
      return;
    }
    this->m_call_number = this->m_call_number + 1;
    dStack_198 = best_solution_recorder<baryonyx::itm::default_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
                 ::reinit(best_recorder,&this->m_local_ctx,(bool)(kappa_start._7_1_ & 1),
                          *(double *)
                           ((long)norm_costs.linear_elements._M_t.
                                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                                  .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x18),
                          *(double *)
                           ((long)norm_costs.linear_elements._M_t.
                                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t
                                  .super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                  super__Head_base<0UL,_double_*,_false>._M_head_impl + 0x28),
                          (bit_array *)&p);
    kappa = dStack_198;
    compute_order::
    init<baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>,baryonyx::bit_array>
              ((compute_order *)local_180,
               (solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                *)&compute.order,(bit_array *)&p);
    i._4_4_ = 0x7fffffff;
    kappa_start._7_1_ = 0;
    _push = 0;
    while( true ) {
      bVar5 = std::atomic<bool>::load(stop_task,seq_cst);
      bVar4 = false;
      if (!bVar5) {
        bVar4 = _push != *(long *)((long)norm_costs.linear_elements._M_t.
                                         super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                         .super__Head_base<0UL,_double_*,_false>._M_head_impl + 0xb0
                                  );
      }
      if (!bVar4) goto LAB_0092094e;
      remaining_1 = compute_order::
                    run<baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>,baryonyx::bit_array,double>
                              ((compute_order *)local_180,
                               (solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                                *)&compute.order,(bit_array *)&p,&(this->m_local_ctx).rng,dStack_198
                               ,local_1d0,theta_00);
      if (remaining_1 == 0) break;
      piVar7 = std::min<int>(&remaining_1,(int *)((long)&i + 4));
      i._4_4_ = *piVar7;
      if ((long)dVar3 < _push) {
        auVar9._0_8_ = pow((double)remaining_1 / (double)(int)slv.c,__y);
        auVar9._8_56_ = extraout_var;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = uVar1;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = dStack_198;
        auVar11 = vfmadd213sd_fma(auVar9._0_16_,auVar11,auVar13);
        dStack_198 = auVar11._0_8_;
      }
      if (dVar2 < dStack_198) goto LAB_0092094e;
      _push = _push + 1;
    }
    dVar8 = default_cost_type<double>::results
                      (original_costs,(bit_array *)&p,
                       (double)x.super_bit_array_impl.m_data._M_t.
                               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                               .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
    best_solution_recorder<baryonyx::itm::default_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
    ::try_update(best_recorder,&this->m_local_ctx,(bit_array *)&p,dVar8,_push);
    i._4_4_ = 0;
    kappa_start._7_1_ = 1;
LAB_0092094e:
    if (i._4_4_ < 1) {
      iter = 0;
      while( true ) {
        bVar5 = std::atomic<bool>::load(stop_task,seq_cst);
        bVar4 = false;
        if (!bVar5) {
          bVar4 = iter < *(int *)((long)norm_costs.linear_elements._M_t.
                                        super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                        .super__Head_base<0UL,_double_*,_false>._M_head_impl + 0xbc)
          ;
        }
        if (!bVar4) break;
        iVar6 = compute_order::
                push_and_run<baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>,baryonyx::bit_array,double>
                          ((compute_order *)local_180,
                           (solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                            *)&compute.order,(bit_array *)&p,&(this->m_local_ctx).rng,kappa_00,
                           local_1d0,theta_00,objective_amplifier);
        if (iVar6 == 0) {
          dVar8 = default_cost_type<double>::results
                            (original_costs,(bit_array *)&p,
                             (double)x.super_bit_array_impl.m_data._M_t.
                                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                     .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
          best_solution_recorder<baryonyx::itm::default_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
          ::try_update(best_recorder,&this->m_local_ctx,(bit_array *)&p,dVar8,
                       (long)(-iter * *(int *)((long)norm_costs.linear_elements._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                                  .super__Head_base<0UL,_double_*,_false>.
                                                  _M_head_impl + 0xc0) + -1));
          kappa_start._7_1_ = 1;
        }
        dStack_198 = kappa;
        local_1b8 = 0;
        while( true ) {
          bVar5 = std::atomic<bool>::load(stop_task,seq_cst);
          bVar4 = false;
          if (!bVar5) {
            bVar4 = (int)local_1b8 <
                    *(int *)((long)norm_costs.linear_elements._M_t.
                                   super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                   super__Head_base<0UL,_double_*,_false>._M_head_impl + 0xc0);
          }
          if (!bVar4) goto LAB_00920c6a;
          iVar6 = compute_order::
                  run<baryonyx::itm::solver_inequalities_101coeff<double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<double>,true>,baryonyx::bit_array,double>
                            ((compute_order *)local_180,
                             (solver_inequalities_101coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                              *)&compute.order,(bit_array *)&p,&(this->m_local_ctx).rng,dStack_198,
                             local_1d0,theta_00);
          if (iVar6 == 0) break;
          if (*(double *)
               ((long)norm_costs.linear_elements._M_t.
                      super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                      super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                      super__Head_base<0UL,_double_*,_false>._M_head_impl + 0xa0) <
              (double)(int)local_1b8) {
            auVar10._0_8_ = pow((double)iVar6 / (double)(int)slv.c,__y);
            auVar10._8_56_ = extraout_var_00;
            auVar12._8_8_ = 0;
            auVar12._0_8_ = uVar1;
            auVar14._8_8_ = 0;
            auVar14._0_8_ = dStack_198;
            auVar11 = vfmadd213sd_fma(auVar10._0_16_,auVar12,auVar14);
            dStack_198 = auVar11._0_8_;
          }
          if (dVar2 < dStack_198) goto LAB_00920c6a;
          local_1b8 = local_1b8 + 1;
        }
        dVar8 = default_cost_type<double>::results
                          (original_costs,(bit_array *)&p,
                           (double)x.super_bit_array_impl.m_data._M_t.
                                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                   .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
        best_solution_recorder<baryonyx::itm::default_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
        ::try_update(best_recorder,&this->m_local_ctx,(bit_array *)&p,dVar8,
                     (long)(int)(~local_1b8 +
                                -iter * *(int *)((long)norm_costs.linear_elements._M_t.
                                                                                                              
                                                  super___uniq_ptr_impl<double,_std::default_delete<double[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                                  .super__Head_base<0UL,_double_*,_false>.
                                                  _M_head_impl + 0xc0)));
        kappa_start._7_1_ = 1;
LAB_00920c6a:
        iter = iter + 1;
      }
    }
    else {
      best_solution_recorder<baryonyx::itm::default_cost_type<double>,_double,_baryonyx::itm::minimize_tag>
      ::try_advance(best_recorder,&this->m_local_ctx,(bit_array *)&p,i._4_4_,
                    *(long *)((long)norm_costs.linear_elements._M_t.
                                    super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                                    _M_t.
                                    super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>
                                    .super__Head_base<0UL,_double_*,_false>._M_head_impl + 0xb0));
    }
  } while( true );
}

Assistant:

void operator()(const std::atomic_bool& stop_task,
                    best_solution_recorder<Cost, Float, Mode>& best_recorder,
                    const std::vector<merged_constraint>& constraints,
                    int variables,
                    const Cost& original_costs,
                    double cost_constant)
    {
        bit_array x(variables);

        auto& p = m_ctx.parameters;

        auto norm_costs = normalize_costs<Float, Cost>(
          m_ctx, original_costs, m_local_ctx.rng, variables);

        const auto kappa_step = static_cast<Float>(p.kappa_step);
        const auto kappa_max = static_cast<Float>(p.kappa_max);
        const auto alpha = static_cast<Float>(p.alpha);
        const auto theta = static_cast<Float>(p.theta);
        const auto delta =
          p.delta < 0
            ? compute_delta<Float, Cost>(m_ctx, norm_costs, theta, variables)
            : static_cast<Float>(p.delta);

        const auto pushing_k_factor = static_cast<Float>(p.pushing_k_factor);
        const auto pushing_objective_amplifier =
          static_cast<Float>(p.pushing_objective_amplifier);

        const auto w_limit = static_cast<long int>(p.w);

        Solver slv(m_local_ctx.rng,
                   length(constraints),
                   variables,
                   norm_costs,
                   constraints);

        compute_order compute(p.order, variables);
        bool is_a_solution = false;

        while (!stop_task.load()) {
            ++m_call_number;
            const auto kappa_start = static_cast<Float>(best_recorder.reinit(
              m_local_ctx, is_a_solution, p.kappa_min, p.kappa_max, x));
            auto kappa = kappa_start;
            compute.init(slv, x);

            auto best_remaining = INT_MAX;
            is_a_solution = false;

            for (long int i = 0; !stop_task.load() && i != p.limit; ++i) {
                auto remaining =
                  compute.run(slv, x, m_local_ctx.rng, kappa, delta, theta);

                if (remaining == 0) {
                    best_recorder.try_update(
                      m_local_ctx,
                      x,
                      original_costs.results(x, cost_constant),
                      i);

                    best_remaining = 0;
                    is_a_solution = true;
                    break;
                } else {
                    best_remaining = std::min(remaining, best_remaining);
                }

                if (i > w_limit)
                    kappa +=
                      kappa_step * std::pow(static_cast<Float>(remaining) /
                                              static_cast<Float>(slv.m),
                                            alpha);

                if (kappa > kappa_max)
                    break;
            }

            if (best_remaining > 0) {
                best_recorder.try_advance(
                  m_local_ctx, x, best_remaining, p.limit);
                continue;
            }

            for (int push = 0; !stop_task.load() && push < p.pushes_limit;
                 ++push) {

                auto remaining =
                  compute.push_and_run(slv,
                                       x,
                                       m_local_ctx.rng,
                                       pushing_k_factor,
                                       delta,
                                       theta,
                                       pushing_objective_amplifier);

                if (remaining == 0) {
                    best_recorder.try_update(
                      m_local_ctx,
                      x,
                      original_costs.results(x, cost_constant),
                      -push * p.pushing_iteration_limit - 1);
                    is_a_solution = true;
                }

                kappa = kappa_start;
                for (int iter = 0;
                     !stop_task.load() && iter < p.pushing_iteration_limit;
                     ++iter) {

                    remaining = compute.run(
                      slv, x, m_local_ctx.rng, kappa, delta, theta);

                    if (remaining == 0) {
                        best_recorder.try_update(
                          m_local_ctx,
                          x,
                          original_costs.results(x, cost_constant),
                          -push * p.pushing_iteration_limit - iter - 1);
                        is_a_solution = true;
                        break;
                    }

                    if (iter > p.w)
                        kappa +=
                          kappa_step * std::pow(static_cast<Float>(remaining) /
                                                  static_cast<Float>(slv.m),
                                                alpha);

                    if (kappa > kappa_max)
                        break;
                }
            }
        }
    }